

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O2

void init_sprite(Sprite *spr,int image,float x,float y,float scale,float opacity)

{
  long lVar1;
  
  spr->image = image;
  spr->x = x;
  spr->y = y;
  spr->scale_y = scale;
  spr->scale_x = scale;
  spr->align_x = 0.5;
  spr->b = 1.0;
  spr->align_y = 0.5;
  spr->angle = 0.0;
  spr->r = 1.0;
  spr->g = 1.0;
  spr->opacity = opacity;
  for (lVar1 = 0x30; lVar1 != 0x170; lVar1 = lVar1 + 0x20) {
    *(undefined8 *)((long)spr->anims + lVar1 + -0x30) = 0;
  }
  return;
}

Assistant:

static void init_sprite(Sprite *spr, int image, float x, float y, float scale,
   float opacity)
{
   int i;

   spr->image = image;
   spr->x = x;
   spr->y = y;
   spr->scale_x = spr->scale_y = scale;
   spr->align_x = spr->align_y = 0.5;
   spr->angle = 0.0;
   spr->r = spr->g = spr->b = 1.0;
   spr->opacity = opacity;
   for (i = 0; i < MAX_ANIMS; i++)
      spr->anims[i].lval = NULL;
}